

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int SetMotorPWMRequestRPLIDAR(RPLIDAR *pRPLIDAR,int pwm)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  undefined2 local_26;
  undefined1 local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  timespec local_20;
  
  local_24 = 2;
  local_26 = 0xf0a5;
  local_23 = (byte)pwm;
  local_22 = (byte)((uint)pwm >> 8);
  local_21 = local_22 ^ local_23 ^ 0x57;
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    uVar4 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_26 + uVar4),(ulong)(6 - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001a93be;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 6);
  }
  else {
    if (iVar1 != 0) {
LAB_001a93be:
      puts("Error writing data to a RPLIDAR. ");
      return 1;
    }
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_26 + uVar4),(ulong)(6 - (int)uVar4));
      if ((int)sVar2 < 1) goto LAB_001a93be;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 6);
  }
  local_20.tv_sec = 0;
  local_20.tv_nsec = 500000000;
  nanosleep(&local_20,(timespec *)0x0);
  return 0;
}

Assistant:

inline int SetMotorPWMRequestRPLIDAR(RPLIDAR* pRPLIDAR, int pwm)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	if (IS_FAIL(pRPLIDAR->drv->setMotorPWM((_u16)pwm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorPWM() failed. \n");
		return EXIT_FAILURE;
	}
#else
	if (SL_IS_FAIL(pRPLIDAR->drv->setMotorSpeed((sl_u16)pwm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorSpeed() failed. \n");
		return EXIT_FAILURE;
	}
#endif // FORCE_RPLIDAR_SDK_V1
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SET_MOTOR_PWM_REQUEST_RPLIDAR,0x02,0,0,0};

	reqbuf[3] = (unsigned char)pwm;
	reqbuf[4] = (unsigned char)(pwm>>8);
	reqbuf[5] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	mSleep(500);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}